

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O2

void GetNodeTransform(aiMatrix4x4 *matrix,Node *node)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  aiMatrix4x4t<float> temp;
  aiMatrix4x4t<float> temp_1;
  aiQuaterniont<float> local_d8;
  aiMatrix4x4t<float> local_c8;
  aiMatrix4x4t<float> local_88;
  aiMatrix3x3t<float> local_40;
  
  if ((node->matrix).isPresent == true) {
    glTFCommon::CopyValue((node->matrix).value,matrix);
    return;
  }
  if ((node->translation).isPresent == true) {
    local_88.a4 = (node->translation).value[0];
    local_88.c4 = (node->translation).value[2];
    local_88.a1 = 1.0;
    local_88.a2 = 0.0;
    local_88.a3 = 0.0;
    local_88.b1 = 0.0;
    local_88.b2 = 1.0;
    local_88.c1 = 0.0;
    local_88.c2 = 0.0;
    local_88.c3 = 1.0;
    local_88.d3 = 0.0;
    local_88.d4 = 1.0;
    local_88.d1 = 0.0;
    local_88.d2 = 0.0;
    local_88._24_8_ = (ulong)(uint)(node->translation).value[1] << 0x20;
    local_c8.a1 = matrix->a1;
    local_c8.a2 = matrix->a2;
    local_c8.a3 = matrix->a3;
    local_c8.a4 = matrix->a4;
    local_c8.b1 = matrix->b1;
    local_c8.b2 = matrix->b2;
    local_c8.b3 = matrix->b3;
    local_c8.b4 = matrix->b4;
    local_c8.c1 = matrix->c1;
    local_c8.c2 = matrix->c2;
    uVar1 = matrix->c3;
    uVar2 = matrix->c4;
    uVar3 = matrix->d1;
    uVar4 = matrix->d2;
    uVar5 = matrix->d3;
    uVar6 = matrix->d4;
    local_c8.c3 = (float)uVar1;
    local_c8.c4 = (float)uVar2;
    local_c8.d1 = (float)uVar3;
    local_c8.d2 = (float)uVar4;
    local_c8.d3 = (float)uVar5;
    local_c8.d4 = (float)uVar6;
    aiMatrix4x4t<float>::operator*=(&local_c8,&local_88);
    matrix->a1 = local_c8.a1;
    matrix->a2 = local_c8.a2;
    matrix->a3 = local_c8.a3;
    matrix->a4 = local_c8.a4;
    matrix->b1 = local_c8.b1;
    matrix->b2 = local_c8.b2;
    matrix->b3 = local_c8.b3;
    matrix->b4 = local_c8.b4;
    matrix->c1 = local_c8.c1;
    matrix->c2 = local_c8.c2;
    matrix->c3 = local_c8.c3;
    matrix->c4 = local_c8.c4;
    matrix->d1 = local_c8.d1;
    matrix->d2 = local_c8.d2;
    matrix->d3 = local_c8.d3;
    matrix->d4 = local_c8.d4;
  }
  if ((node->rotation).isPresent == true) {
    local_d8.x = (node->rotation).value[0];
    local_d8.y = (node->rotation).value[1];
    local_d8.z = (node->rotation).value[2];
    local_d8.w = (node->rotation).value[3];
    aiQuaterniont<float>::GetMatrix(&local_40,&local_d8);
    local_c8.a1 = local_40.a1;
    local_c8.a2 = local_40.a2;
    local_c8.a4 = 0.0;
    local_c8.a3 = local_40.a3;
    local_c8.b1 = local_40.b1;
    local_c8.b2 = local_40.b2;
    local_c8.b4 = 0.0;
    local_c8.b3 = local_40.b3;
    local_c8.c1 = local_40.c1;
    local_c8.c2 = local_40.c2;
    local_c8.c3 = local_40.c3;
    local_c8.c4 = 0.0;
    local_c8.d1 = 0.0;
    local_c8.d2 = 0.0;
    local_c8.d3 = 0.0;
    local_c8.d4 = 1.0;
    uVar7 = matrix->a1;
    uVar8 = matrix->a2;
    uVar9 = matrix->a3;
    uVar10 = matrix->a4;
    uVar11 = matrix->b1;
    uVar12 = matrix->b2;
    local_88.b3 = matrix->b3;
    local_88.b4 = matrix->b4;
    local_88.c1 = matrix->c1;
    local_88.c2 = matrix->c2;
    uVar13 = matrix->c3;
    uVar14 = matrix->c4;
    uVar15 = matrix->d1;
    uVar16 = matrix->d2;
    uVar17 = matrix->d3;
    uVar18 = matrix->d4;
    local_88.a1 = (float)uVar7;
    local_88.a2 = (float)uVar8;
    local_88.a3 = (float)uVar9;
    local_88.a4 = (float)uVar10;
    local_88.b1 = (float)uVar11;
    local_88.b2 = (float)uVar12;
    local_88.c3 = (float)uVar13;
    local_88.c4 = (float)uVar14;
    local_88.d1 = (float)uVar15;
    local_88.d2 = (float)uVar16;
    local_88.d3 = (float)uVar17;
    local_88.d4 = (float)uVar18;
    aiMatrix4x4t<float>::operator*=(&local_88,&local_c8);
    matrix->a1 = local_88.a1;
    matrix->a2 = local_88.a2;
    matrix->a3 = local_88.a3;
    matrix->a4 = local_88.a4;
    matrix->b1 = local_88.b1;
    matrix->b2 = local_88.b2;
    matrix->b3 = local_88.b3;
    matrix->b4 = local_88.b4;
    matrix->c1 = local_88.c1;
    matrix->c2 = local_88.c2;
    matrix->c3 = local_88.c3;
    matrix->c4 = local_88.c4;
    matrix->d1 = local_88.d1;
    matrix->d2 = local_88.d2;
    matrix->d3 = local_88.d3;
    matrix->d4 = local_88.d4;
  }
  if ((node->scale).isPresent == true) {
    local_88.a1 = (node->scale).value[0];
    local_88.b2 = (node->scale).value[1];
    local_88.c3 = (node->scale).value[2];
    local_88.a2 = 0.0;
    local_88.a3 = 0.0;
    local_88.a4 = 0.0;
    local_88.b1 = 0.0;
    local_88.b3 = 0.0;
    local_88.b4 = 0.0;
    local_88.c1 = 0.0;
    local_88.c2 = 0.0;
    local_88.c4 = 0.0;
    local_88.d1 = 0.0;
    local_88.d2 = 0.0;
    local_88.d3 = 0.0;
    local_88.d4 = 1.0;
    local_c8.a1 = matrix->a1;
    local_c8.a2 = matrix->a2;
    local_c8.a3 = matrix->a3;
    local_c8.a4 = matrix->a4;
    local_c8.b1 = matrix->b1;
    local_c8.b2 = matrix->b2;
    local_c8.b3 = matrix->b3;
    local_c8.b4 = matrix->b4;
    local_c8.c1 = matrix->c1;
    local_c8.c2 = matrix->c2;
    uVar19 = matrix->c3;
    uVar20 = matrix->c4;
    uVar21 = matrix->d1;
    uVar22 = matrix->d2;
    uVar23 = matrix->d3;
    uVar24 = matrix->d4;
    local_c8.c3 = (float)uVar19;
    local_c8.c4 = (float)uVar20;
    local_c8.d1 = (float)uVar21;
    local_c8.d2 = (float)uVar22;
    local_c8.d3 = (float)uVar23;
    local_c8.d4 = (float)uVar24;
    aiMatrix4x4t<float>::operator*=(&local_c8,&local_88);
    matrix->a1 = local_c8.a1;
    matrix->a2 = local_c8.a2;
    matrix->a3 = local_c8.a3;
    matrix->a4 = local_c8.a4;
    matrix->b1 = local_c8.b1;
    matrix->b2 = local_c8.b2;
    matrix->b3 = local_c8.b3;
    matrix->b4 = local_c8.b4;
    matrix->c1 = local_c8.c1;
    matrix->c2 = local_c8.c2;
    matrix->c3 = local_c8.c3;
    matrix->c4 = local_c8.c4;
    matrix->d1 = local_c8.d1;
    matrix->d2 = local_c8.d2;
    matrix->d3 = local_c8.d3;
    matrix->d4 = local_c8.d4;
  }
  return;
}

Assistant:

static void GetNodeTransform(aiMatrix4x4& matrix, const glTF2::Node& node) {
    if (node.matrix.isPresent) {
        CopyValue(node.matrix.value, matrix);
    }
    else {
        if (node.translation.isPresent) {
            aiVector3D trans;
            CopyValue(node.translation.value, trans);
            aiMatrix4x4 t;
            aiMatrix4x4::Translation(trans, t);
            matrix = matrix * t;
        }

        if (node.rotation.isPresent) {
            aiQuaternion rot;
            CopyValue(node.rotation.value, rot);
            matrix = matrix * aiMatrix4x4(rot.GetMatrix());
        }

        if (node.scale.isPresent) {
            aiVector3D scal(1.f);
            CopyValue(node.scale.value, scal);
            aiMatrix4x4 s;
            aiMatrix4x4::Scaling(scal, s);
            matrix = matrix * s;
        }
    }
}